

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int seekAndWriteFd(int fd,i64 iOff,void *pBuf,int nBuf,int *piErrno)

{
  int iVar1;
  __off64_t _Var2;
  int *piVar3;
  bool bVar4;
  int local_44;
  i64 iSeek;
  int rc;
  int *piErrno_local;
  int nBuf_local;
  void *pBuf_local;
  i64 iOff_local;
  int fd_local;
  
  do {
    _Var2 = lseek64(fd,iOff,0);
    if (_Var2 != iOff) {
      if (piErrno != (int *)0x0) {
        if (_Var2 == -1) {
          piVar3 = __errno_location();
          local_44 = *piVar3;
        }
        else {
          local_44 = 0;
        }
        *piErrno = local_44;
      }
      return -1;
    }
    iVar1 = (*aSyscall[0xb].pCurrent)((ulong)(uint)fd,pBuf,(long)(int)(nBuf & 0x1ffff));
    bVar4 = false;
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  if ((iVar1 < 0) && (piErrno != (int *)0x0)) {
    piVar3 = __errno_location();
    *piErrno = *piVar3;
  }
  return iVar1;
}

Assistant:

static int seekAndWriteFd(
  int fd,                         /* File descriptor to write to */
  i64 iOff,                       /* File offset to begin writing at */
  const void *pBuf,               /* Copy data from this buffer to the file */
  int nBuf,                       /* Size of buffer pBuf in bytes */
  int *piErrno                    /* OUT: Error number if error occurs */
){
  int rc = 0;                     /* Value returned by system call */

  assert( nBuf==(nBuf&0x1ffff) );
  nBuf &= 0x1ffff;
  TIMER_START;

#if defined(USE_PREAD)
  do{ rc = osPwrite(fd, pBuf, nBuf, iOff); }while( rc<0 && errno==EINTR );
#elif defined(USE_PREAD64)
  do{ rc = osPwrite64(fd, pBuf, nBuf, iOff);}while( rc<0 && errno==EINTR);
#else
  do{
    i64 iSeek = lseek(fd, iOff, SEEK_SET);
    SimulateIOError( iSeek-- );

    if( iSeek!=iOff ){
      if( piErrno ) *piErrno = (iSeek==-1 ? errno : 0);
      return -1;
    }
    rc = osWrite(fd, pBuf, nBuf);
  }while( rc<0 && errno==EINTR );
#endif

  TIMER_END;
  OSTRACE(("WRITE   %-3d %5d %7lld %llu\n", fd, rc, iOff, TIMER_ELAPSED));

  if( rc<0 && piErrno ) *piErrno = errno;
  return rc;
}